

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O3

clientinfo * server::aiman::findaiclient(clientinfo *exclude)

{
  clientinfo *pcVar1;
  clientinfo *pcVar2;
  long lVar3;
  bool bVar4;
  
  if ((long)DAT_00193844 < 1) {
    pcVar2 = (clientinfo *)0x0;
  }
  else {
    lVar3 = 0;
    pcVar2 = (clientinfo *)0x0;
    do {
      pcVar1 = *(clientinfo **)(clients + lVar3 * 8);
      if ((-1 < pcVar1->clientnum) && ((pcVar1->state).super_fpsstate.aitype == 0)) {
        if (((pcVar1->state).state == 5) && (pcVar1->local == false)) {
          bVar4 = pcVar1->privilege == 0;
        }
        else {
          bVar4 = false;
        }
        if (((pcVar1 != exclude) && (!bVar4)) &&
           ((pcVar2 == (clientinfo *)0x0 || ((pcVar1->bots).ulen < (pcVar2->bots).ulen)))) {
          pcVar2 = pcVar1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (DAT_00193844 != lVar3);
  }
  return pcVar2;
}

Assistant:

clientinfo *findaiclient(clientinfo *exclude = NULL)
    {
        clientinfo *least = NULL;
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(!validaiclient(ci) || ci==exclude) continue;
            if(!least || ci->bots.length() < least->bots.length()) least = ci;
        }
        return least;
    }